

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O3

int priv_encdec_stub(char *name,_func_int_int_uchar_ptr_uchar_ptr_RSA_ptr_int *func,expbuf_t *buf)

{
  size_t *psVar1;
  char *pcVar2;
  ulong uVar3;
  size_t key_index;
  size_t sVar4;
  uint uVar5;
  RSA *r;
  int *piVar6;
  ulong *puVar7;
  uchar to [4096];
  uchar local_1038 [4104];
  
  puVar7 = (ulong *)buf->start;
  pcVar2 = buf->end;
  if (7 < (ulong)((long)pcVar2 - (long)puVar7)) {
    uVar3 = *puVar7;
    puVar7 = puVar7 + 1;
    buf->start = (char *)puVar7;
    if (uVar3 <= (ulong)((long)pcVar2 - (long)puVar7)) {
      psVar1 = (size_t *)((long)puVar7 + uVar3);
      buf->start = (char *)psVar1;
      if (7 < (ulong)((long)pcVar2 - (long)psVar1)) {
        key_index = *psVar1;
        buf->start = (char *)(psVar1 + 1);
        if (7 < (ulong)((long)pcVar2 - (long)(psVar1 + 1))) {
          sVar4 = psVar1[1];
          buf->start = (char *)(psVar1 + 2);
          r = (RSA *)daemon_get_rsa(key_index);
          if (r == (RSA *)0x0) {
            piVar6 = __errno_location();
            *piVar6 = 0;
            warnf("%s: invalid key index:%zu\n",name,key_index);
            return -1;
          }
          uVar5 = (*func)((int)uVar3,(uchar *)puVar7,local_1038,(RSA *)r,(int)sVar4);
          expbuf_dispose(buf);
          RSA_free(r);
          expbuf_reserve(buf,8);
          *(long *)buf->end = (long)(int)uVar5;
          buf->end = buf->end + 8;
          if ((int)uVar5 < 1) {
            uVar5 = 0;
          }
          expbuf_push_bytes(buf,local_1038,(ulong)uVar5);
          return 0;
        }
      }
    }
  }
  piVar6 = __errno_location();
  *piVar6 = 0;
  warnf("%s: failed to parse request",name);
  return -1;
}

Assistant:

static int priv_encdec_stub(const char *name,
                            int (*func)(int flen, const unsigned char *from, unsigned char *to, RSA *rsa, int padding),
                            struct expbuf_t *buf)
{
    unsigned char *from, to[4096];
    size_t flen;
    size_t key_index, padding;
    RSA *rsa;
    int ret;

    if ((from = expbuf_shift_bytes(buf, &flen)) == NULL || expbuf_shift_num(buf, &key_index) != 0 ||
        expbuf_shift_num(buf, &padding) != 0) {
        errno = 0;
        warnf("%s: failed to parse request", name);
        return -1;
    }
    if ((rsa = daemon_get_rsa(key_index)) == NULL) {
        errno = 0;
        warnf("%s: invalid key index:%zu\n", name, key_index);
        return -1;
    }
    ret = func((int)flen, from, to, rsa, (int)padding);
    expbuf_dispose(buf);
    RSA_free(rsa);

    expbuf_push_num(buf, ret);
    expbuf_push_bytes(buf, to, ret > 0 ? ret : 0);

    return 0;
}